

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordCallback_Test::TestBody
          (SSLVersionTest_RecordCallback_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  _func_void_int_int_int_void_ptr_size_t_SSL_ptr_void_ptr *cb_00;
  char *pcVar3;
  char *in_R9;
  SSL_CTX *local_1f0;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_138;
  Message local_130;
  ClientConfig local_128;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  SSL_CTX *ctx;
  CallbackType cb;
  bool write_seen;
  bool read_seen;
  Message local_80;
  uint local_74;
  undefined1 local_70 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ScopedTrace local_42;
  bool local_41;
  ScopedTrace gtest_trace_4631;
  const_iterator pbStack_40;
  bool test_server;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_28;
  initializer_list<bool> *local_18;
  initializer_list<bool> *__range2;
  SSLVersionTest_RecordCallback_Test *this_local;
  
  __range2 = (initializer_list<bool> *)this;
  uVar2 = SSLVersionTest::version(&this->super_SSLVersionTest);
  if (uVar2 != 0xfefc) {
    __begin2._6_1_ = 1;
    __begin2._7_1_ = 0;
    local_28._M_array = (iterator)((long)&__begin2 + 6);
    local_28._M_len = 2;
    local_18 = &local_28;
    __end2 = std::initializer_list<bool>::begin(local_18);
    pbStack_40 = std::initializer_list<bool>::end(local_18);
    for (; __end2 != pbStack_40; __end2 = __end2 + 1) {
      local_41 = (bool)(*__end2 & 1);
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_42,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1217,&local_41);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)local_70);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
        }
        bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                          ((HasNewFatalFailureHelper *)local_70);
        if (bVar1) {
          local_74 = 4;
        }
        else {
          local_74 = 0;
        }
        testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)local_70);
        if (local_74 == 0) {
          cb.this._7_1_ = 0;
          cb.this._6_1_ = 0;
          ctx = (SSL_CTX *)((long)&cb.this + 6);
          cb.write_seen = (bool *)((long)&cb.this + 7);
          cb.read_seen = (bool *)this;
          if ((local_41 & 1U) == 0) {
            local_1f0 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).client_ctx_);
          }
          else {
            local_1f0 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).server_ctx_);
          }
          cb_00 = (anonymous_namespace)::SSLVersionTest_RecordCallback_Test::TestBody()::$_0::
                  operator_cast_to_function_pointer
                            ((__0 *)((long)&gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 7));
          SSL_CTX_set_msg_callback((SSL_CTX *)local_1f0,(cb *)cb_00);
          SSL_CTX_set_msg_callback_arg(local_1f0,&ctx);
          local_128.verify_hostname.field_2._M_allocated_capacity = 0;
          local_128.verify_hostname.field_2._8_8_ = 0;
          local_128.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
          local_128.verify_hostname._1_7_ = 0;
          local_128.verify_hostname._M_string_length = 0;
          local_128.servername.field_2._M_allocated_capacity = 0;
          local_128.servername.field_2._8_8_ = 0;
          local_128.servername._M_dataplus = (_Alloc_hider)0x0;
          local_128.servername._1_7_ = 0;
          local_128.servername._M_string_length = 0;
          local_128.session = (SSL_SESSION *)0x0;
          local_128.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
          local_128.hostflags = 0;
          local_128.early_data = false;
          local_128._85_3_ = 0;
          ClientConfig::ClientConfig(&local_128);
          local_c9 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_128);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
          ClientConfig::~ClientConfig(&local_128);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
          if (!bVar1) {
            testing::Message::Message(&local_130);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__1.message_,(internal *)local_c8,
                       (AssertionResult *)"Connect()","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1247,pcVar3);
            testing::internal::AssertHelper::operator=(&local_138,&local_130);
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
            testing::Message::~Message(&local_130);
          }
          local_74 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
          if (local_74 == 0) {
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_168,(bool *)((long)&cb.this + 7),(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
            if (!bVar1) {
              testing::Message::Message(&local_170);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__2.message_,(internal *)local_168,
                         (AssertionResult *)"read_seen","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_178,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1249,pcVar3);
              testing::internal::AssertHelper::operator=(&local_178,&local_170);
              testing::internal::AssertHelper::~AssertHelper(&local_178);
              std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
              testing::Message::~Message(&local_170);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1a8,(bool *)((long)&cb.this + 6),(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_1d8,(internal *)local_1a8,(AssertionResult *)"write_seen","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x124a,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&local_1d8);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            local_74 = 0;
          }
        }
        else if (local_74 == 4) goto LAB_001ccf85;
      }
      else {
LAB_001ccf85:
        testing::Message::Message(&local_80);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1218,
                   "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff78,&local_80);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff78);
        testing::Message::~Message(&local_80);
        local_74 = 1;
      }
      testing::ScopedTrace::~ScopedTrace(&local_42);
      if (local_74 != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordCallback) {
  if (version() == DTLS1_3_VERSION) {
    // The DTLS 1.3 record header is vastly different than the TLS or DTLS < 1.3
    // header format. Instead of checking that the record header is formatted as
    // expected here, the runner implementation in dtls.go is strict about what
    // it accepts.
    return;
  }
  for (bool test_server : {true, false}) {
    SCOPED_TRACE(test_server);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());

    bool read_seen = false;
    bool write_seen = false;
    auto cb = [&](int is_write, int cb_version, int cb_type, const void *buf,
                  size_t len, SSL *ssl) {
      if (cb_type != SSL3_RT_HEADER) {
        return;
      }

      // The callback does not report a version for records.
      EXPECT_EQ(0, cb_version);

      if (is_write) {
        write_seen = true;
      } else {
        read_seen = true;
      }

      // Sanity-check that the record header is plausible.
      CBS cbs;
      CBS_init(&cbs, reinterpret_cast<const uint8_t *>(buf), len);
      uint8_t type;
      uint16_t record_version, length;
      ASSERT_TRUE(CBS_get_u8(&cbs, &type));
      ASSERT_TRUE(CBS_get_u16(&cbs, &record_version));
      EXPECT_EQ(record_version >> 8, is_dtls() ? 0xfe : 0x03);
      if (is_dtls()) {
        uint16_t epoch;
        ASSERT_TRUE(CBS_get_u16(&cbs, &epoch));
        uint16_t max_epoch = 1;
        EXPECT_LE(epoch, max_epoch) << "Invalid epoch: " << epoch;
        ASSERT_TRUE(CBS_skip(&cbs, 6));
      }
      ASSERT_TRUE(CBS_get_u16(&cbs, &length));
      EXPECT_EQ(0u, CBS_len(&cbs));
    };
    using CallbackType = decltype(cb);
    SSL_CTX *ctx = test_server ? server_ctx_.get() : client_ctx_.get();
    SSL_CTX_set_msg_callback(
        ctx, [](int is_write, int cb_version, int cb_type, const void *buf,
                size_t len, SSL *ssl, void *arg) {
          CallbackType *cb_ptr = reinterpret_cast<CallbackType *>(arg);
          (*cb_ptr)(is_write, cb_version, cb_type, buf, len, ssl);
        });
    SSL_CTX_set_msg_callback_arg(ctx, &cb);

    ASSERT_TRUE(Connect());

    EXPECT_TRUE(read_seen);
    EXPECT_TRUE(write_seen);
  }
}